

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

Blob * jbcoin::generatePublicDeterministicKey(Blob *__return_storage_ptr__,Blob *pubGen,int seq)

{
  bn_ctx ctx;
  ec_point newPoint;
  bignum hash;
  ec_point rootPubKey;
  bignum local_40;
  ec_point local_38;
  bignum local_30;
  ec_point local_28;
  
  openssl::bignum::bignum<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_40,pubGen);
  openssl::bn2point((openssl *)&local_28,openssl::secp256k1curve,local_40.ptr);
  openssl::bignum::~bignum(&local_40);
  openssl::bn_ctx::bn_ctx((bn_ctx *)&local_40);
  makeHash((Blob *)&local_30,(int)pubGen,(bignum *)(ulong)(uint)seq);
  openssl::multiply((openssl *)&local_38,openssl::secp256k1curve,&local_30,(bn_ctx *)&local_40);
  openssl::add_to(openssl::secp256k1curve,&local_28,&local_38,(bn_ctx *)&local_40);
  serialize_ec_point(__return_storage_ptr__,&local_38);
  openssl::ec_point::~ec_point(&local_38);
  openssl::bignum::~bignum(&local_30);
  openssl::bn_ctx::~bn_ctx((bn_ctx *)&local_40);
  openssl::ec_point::~ec_point(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Blob generatePublicDeterministicKey (Blob const& pubGen, int seq)
{
    // publicKey(n) = rootPublicKey EC_POINT_+ Hash(pubHash|seq)*point
    ec_point rootPubKey = generateRootPubKey (bignum (pubGen));

    bn_ctx ctx;

    // Calculate the private additional key.
    bignum hash = makeHash (pubGen, seq, secp256k1curve.order);

    // Calculate the corresponding public key.
    ec_point newPoint = multiply (secp256k1curve.group, hash, ctx);

    // Add the master public key and set.
    add_to (secp256k1curve.group, rootPubKey, newPoint, ctx);

    return serialize_ec_point (newPoint);
}